

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::set_last_prop(CVmImageLoader *this,vm_prop_id_t last_prop)

{
  int iVar1;
  vm_val_t new_cont;
  vm_val_t new_val;
  vm_val_t idx_val;
  undefined1 local_30 [16];
  undefined4 local_20;
  vm_prop_id_t local_18;
  undefined4 local_10;
  undefined4 local_8;
  
  local_10 = 7;
  local_8 = 1;
  local_20 = 6;
  local_18 = G_predef_X.last_prop;
  iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[G_predef_X.last_prop_obj >> 0xc]
                                 [G_predef_X.last_prop_obj & 0xfff].ptr_ + 0x140))
                    (G_obj_table_X.pages_[G_predef_X.last_prop_obj >> 0xc] +
                     (G_predef_X.last_prop_obj & 0xfff),local_30);
  if (iVar1 != 0) {
    return;
  }
  err_throw(0x7de);
}

Assistant:

void CVmImageLoader::set_last_prop(VMG_ vm_prop_id_t last_prop)
{
    /* get the LastPropObj vector */
    CVmObjVector *vec = (CVmObjVector *)vm_objp(vmg_ G_predef->last_prop_obj);

    /* 
     *   set up the values - the index is always 1, since the vector
     *   contains only one element; and the value contains the new last
     *   property ID 
     */
    vm_val_t idx_val, new_val;
    idx_val.set_int(1);
    new_val.set_propid(G_predef->last_prop);

    /* update the vector */
    vm_val_t new_cont;
    vec->set_index_val(vmg_ &new_cont, G_predef->last_prop_obj,
                       &idx_val, &new_val);
}